

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O3

ValueT * Qentem::JSON::JSONParser<char,_Qentem::StringStream<char>_>::parseArray
                   (ValueT *__return_storage_ptr__,StringStream<char> *stream,char *content,
                   SizeT *offset,SizeT length)

{
  int iVar1;
  SizeT SVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ValueT local_48;
  
  uVar6 = *offset;
  uVar3 = (ulong)uVar6;
  uVar4 = uVar3;
  if (uVar6 < length) {
    do {
      uVar6 = uVar6 + 1;
      uVar4 = uVar3;
      if ((0x20 < (ulong)(byte)content[uVar3]) ||
         ((0x100002600U >> ((ulong)(byte)content[uVar3] & 0x3f) & 1) == 0)) break;
      uVar3 = uVar3 + 1;
      *offset = uVar6;
      uVar4 = (ulong)length;
    } while ((1 - length) + uVar6 != 1);
  }
  uVar6 = (uint)uVar4;
  (__return_storage_ptr__->field_0).array_.storage_ = (Value<char> *)0x0;
  *(SizeT *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  *(SizeT *)((long)&__return_storage_ptr__->field_0 + 0xc) = 0;
  __return_storage_ptr__->type_ = Array;
  if (content[uVar4 & 0xffffffff] != ']') {
    if (uVar6 < length) {
      while( true ) {
        parseValue(&local_48,stream,content,offset,length);
        Array<Qentem::Value<char>_>::operator+=
                  ((Array<Qentem::Value<char>_> *)__return_storage_ptr__,&local_48);
        Value<char>::~Value(&local_48);
        uVar6 = *offset;
        uVar4 = (ulong)uVar6;
        if (uVar6 < length) {
          while( true ) {
            uVar6 = uVar6 + 1;
            if ((0x20 < (ulong)(byte)content[uVar4]) ||
               ((0x100002600U >> ((ulong)(byte)content[uVar4] & 0x3f) & 1) == 0)) break;
            uVar4 = uVar4 + 1;
            *offset = uVar6;
            if (-length + 1 + uVar6 == 1) goto LAB_0010f740;
          }
        }
        uVar6 = (uint)uVar4;
        if (length <= uVar6) goto LAB_0010f740;
        if (content[uVar4 & 0xffffffff] != ',') break;
        uVar5 = uVar6 + 1;
        uVar4 = (ulong)uVar5;
        *offset = uVar5;
        if (uVar5 < length) {
          SVar2 = uVar6 + 2;
          uVar4 = (ulong)uVar5;
          while (((ulong)(byte)content[uVar4] < 0x21 &&
                 ((0x100002600U >> ((ulong)(byte)content[uVar4] & 0x3f) & 1) != 0))) {
            iVar1 = -length + 1 + SVar2;
            uVar4 = uVar4 + 1;
            *offset = SVar2;
            SVar2 = SVar2 + 1;
            if (iVar1 == 1) goto LAB_0010f740;
          }
        }
        if (length <= (uint)uVar4) goto LAB_0010f740;
      }
      if (content[uVar4 & 0xffffffff] == ']') goto LAB_0010f74f;
    }
LAB_0010f740:
    Value<char>::reset(__return_storage_ptr__);
    __return_storage_ptr__->type_ = Undefined;
    uVar6 = *offset;
  }
LAB_0010f74f:
  *offset = uVar6 + 1;
  return __return_storage_ptr__;
}

Assistant:

static ValueT parseArray(Stream_T &stream, const Char_T *content, SizeT &offset, const SizeT length) {
            StringUtils::TrimLeft(content, offset, length);

            ValueT value{ValueType::Array};

            if (content[offset] != JSONotation::ESquareChar) {
                Array<ValueT> *arr = value.GetArray();

                while (offset < length) {
                    *arr += parseValue(stream, content, offset, length);
                    StringUtils::TrimLeft(content, offset, length);

                    if (offset < length) {
                        const Char_T ch = content[offset];

                        if (ch == JSONotation::CommaChar) {
                            ++offset;
                            StringUtils::TrimLeft(content, offset, length);
                            continue;
                        }

                        if (ch == JSONotation::ESquareChar) {
                            ++offset;
                            return value;
                        }
                    }

                    break;
                }

                value.Reset();
            }

            ++offset;
            return value;
        }